

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.c
# Opt level: O0

uint64_t getRawTime(void)

{
  undefined1 local_30 [8];
  timeval tv;
  timespec ts;
  
  if (_glfw.posix_time.monotonic == '\0') {
    gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
    ts.tv_nsec = (long)local_30 * 1000000 + tv.tv_sec;
  }
  else {
    clock_gettime(1,(timespec *)&tv.tv_usec);
    ts.tv_nsec = tv.tv_usec * 1000000000 + ts.tv_sec;
  }
  return ts.tv_nsec;
}

Assistant:

static uint64_t getRawTime(void)
{
#if defined(CLOCK_MONOTONIC)
    if (_glfw.posix_time.monotonic)
    {
        struct timespec ts;

        clock_gettime(CLOCK_MONOTONIC, &ts);
        return (uint64_t) ts.tv_sec * (uint64_t) 1000000000 + (uint64_t) ts.tv_nsec;
    }
    else
#endif
    {
        struct timeval tv;

        gettimeofday(&tv, NULL);
        return (uint64_t) tv.tv_sec * (uint64_t) 1000000 + (uint64_t) tv.tv_usec;
    }
}